

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MergePrefixLists(Fts5Index *p,Fts5Buffer *p1,Fts5Buffer *p2)

{
  i64 iVar1;
  i64 iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  i64 *piOff;
  int *piVar6;
  long lVar7;
  u8 *puVar8;
  size_t __n;
  u8 *puVar9;
  int n;
  uint uVar10;
  u32 uVar11;
  u8 *puVar12;
  bool bVar13;
  int iOff1;
  i64 iPrev;
  i64 iPos2;
  i64 iPos1;
  Fts5Buffer tmp;
  int iOff2;
  Fts5DoclistIter i2;
  Fts5DoclistIter i1;
  int local_e4;
  i64 local_e0;
  i64 local_d8;
  i64 local_d0;
  Fts5Buffer local_c8;
  int local_ac;
  Fts5Buffer local_a8;
  long local_90;
  Fts5DoclistIter local_88;
  Fts5DoclistIter local_68;
  int *local_48;
  Fts5Buffer *local_40;
  u8 *local_38;
  
  if (p2->n == 0) {
    return;
  }
  local_a8.p = (u8 *)0x0;
  local_a8.n = 0;
  local_a8.nSpace = 0;
  local_c8.p = (u8 *)0x0;
  local_c8.n = 0;
  local_c8.nSpace = 0;
  iVar3 = sqlite3Fts5BufferSize(&p->rc,&local_a8,p2->n + p1->n + 0x1d);
  if (iVar3 != 0) {
    return;
  }
  local_68.nPoslist = 0;
  local_68.nSize = 0;
  local_68.iRowid = 0;
  local_68.aPoslist = p1->p;
  local_68.aEof = local_68.aPoslist + p1->n;
  local_48 = &p->rc;
  local_40 = p1;
  fts5DoclistIterNext(&local_68);
  local_88.nPoslist = 0;
  local_88.nSize = 0;
  local_88.iRowid = 0;
  local_88.aPoslist = p2->p;
  local_88.aEof = local_88.aPoslist + p2->n;
  fts5DoclistIterNext(&local_88);
  lVar5 = 0;
  local_38 = local_a8.p;
  puVar9 = local_a8.p;
  uVar11 = local_a8.n;
  do {
    iVar2 = local_68.iRowid;
    iVar1 = local_88.iRowid;
    if (local_68.iRowid < local_88.iRowid) {
      iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)uVar11,local_68.iRowid - lVar5);
      lVar5 = (long)local_68.nPoslist;
      lVar7 = (long)local_68.nSize;
      memcpy(puVar9 + (int)(iVar3 + uVar11),local_68.aPoslist,lVar7 + lVar5);
      uVar11 = iVar3 + uVar11 + (int)(lVar7 + lVar5);
      fts5DoclistIterNext(&local_68);
      bVar13 = local_68.aPoslist == (u8 *)0x0;
      lVar5 = iVar2;
    }
    else if (local_68.iRowid == local_88.iRowid) {
      local_d0 = 0;
      local_d8 = 0;
      local_e4 = 0;
      puVar12 = local_68.aPoslist + local_68.nSize;
      local_ac = 0;
      puVar8 = local_88.aPoslist + local_88.nSize;
      local_e0 = 0;
      local_90 = local_88.iRowid;
      iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)uVar11,local_88.iRowid - lVar5);
      piVar6 = local_48;
      uVar11 = iVar3 + uVar11;
      local_c8._8_8_ = local_c8._8_8_ & 0xffffffff00000000;
      iVar4 = local_68.nPoslist;
      iVar3 = local_88.nPoslist;
      sqlite3Fts5BufferSize(local_48,&local_c8,local_88.nPoslist + local_68.nPoslist);
      if (*piVar6 != 0) {
        lVar5 = local_90;
        local_a8.n = uVar11;
        goto LAB_001cd5ec;
      }
      sqlite3Fts5PoslistNext64(puVar12,iVar4,&local_e4,&local_d0);
      piVar6 = &local_ac;
      sqlite3Fts5PoslistNext64(puVar8,iVar3,piVar6,&local_d8);
      if (local_d0 < local_d8) {
        sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d0);
        piVar6 = &local_e4;
        piOff = &local_d0;
        puVar9 = puVar12;
        n = iVar4;
      }
      else {
        sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d8);
        piOff = &local_d8;
        puVar9 = puVar8;
        n = iVar3;
      }
      sqlite3Fts5PoslistNext64(puVar9,n,piVar6,piOff);
      if (-1 < local_d0) {
        while (-1 < local_d8) {
          while (local_d0 < local_d8) {
            if (local_d0 != local_e0) {
              sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d0);
            }
            sqlite3Fts5PoslistNext64(puVar12,iVar4,&local_e4,&local_d0);
            if (local_d0 < 0) goto LAB_001cd4f2;
          }
          sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d8);
          sqlite3Fts5PoslistNext64(puVar8,iVar3,&local_ac,&local_d8);
        }
      }
LAB_001cd4f2:
      if (local_d0 < 0) {
        sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d8);
        puVar12 = puVar8 + local_ac;
        uVar10 = iVar3 - local_ac;
      }
      else {
        if (local_d0 != local_e0) {
          sqlite3Fts5PoslistSafeAppend(&local_c8,&local_e0,local_d0);
        }
        puVar12 = puVar12 + local_e4;
        uVar10 = iVar4 - local_e4;
      }
      if (0 < (int)uVar10) {
        iVar3 = local_c8.n;
        memcpy(local_c8.p + local_c8.n,puVar12,(ulong)uVar10);
        local_c8.n = uVar10 + iVar3;
      }
      puVar9 = local_38;
      iVar3 = local_c8.n;
      __n = (size_t)local_c8.n;
      iVar4 = sqlite3Fts5PutVarint(local_38 + (int)uVar11,__n * 2);
      memcpy(puVar9 + (int)(iVar4 + uVar11),local_c8.p,__n);
      uVar11 = iVar4 + uVar11 + iVar3;
      fts5DoclistIterNext(&local_68);
      fts5DoclistIterNext(&local_88);
      lVar5 = local_90;
      if (local_68.aPoslist == (u8 *)0x0) break;
      bVar13 = local_88.aPoslist == (u8 *)0x0;
    }
    else {
      iVar3 = sqlite3Fts5PutVarint(puVar9 + (int)uVar11,local_88.iRowid - lVar5);
      lVar5 = (long)local_88.nPoslist;
      lVar7 = (long)local_88.nSize;
      memcpy(puVar9 + (int)(iVar3 + uVar11),local_88.aPoslist,lVar7 + lVar5);
      uVar11 = iVar3 + uVar11 + (int)(lVar7 + lVar5);
      fts5DoclistIterNext(&local_88);
      bVar13 = local_88.aPoslist == (u8 *)0x0;
      lVar5 = iVar1;
    }
  } while (!bVar13);
  local_a8.n = uVar11;
LAB_001cd5ec:
  puVar12 = local_68.aPoslist;
  puVar8 = local_88.aPoslist;
  puVar9 = local_a8.p;
  if (local_68.aPoslist == (u8 *)0x0) {
    if (local_88.aPoslist == (u8 *)0x0) goto LAB_001cd683;
    lVar7 = (long)local_a8.n;
    iVar3 = sqlite3Fts5PutVarint(local_a8.p + lVar7,local_88.iRowid - lVar5);
    lVar7 = iVar3 + lVar7;
    local_a8.n = (int)lVar7;
    puVar12 = local_88.aEof;
  }
  else {
    lVar7 = (long)local_a8.n;
    iVar3 = sqlite3Fts5PutVarint(local_a8.p + lVar7,local_68.iRowid - lVar5);
    lVar7 = iVar3 + lVar7;
    local_a8.n = (int)lVar7;
    puVar8 = puVar12;
    puVar12 = local_68.aEof;
  }
  memcpy(puVar9 + lVar7,puVar8,(long)puVar12 - (long)puVar8);
  local_a8.n = (int)((long)puVar12 - (long)puVar8) + (int)lVar7;
LAB_001cd683:
  puVar9 = local_a8.p;
  local_40->n = 0;
  sqlite3Fts5BufferAppendBlob(local_48,local_40,local_a8.n,local_a8.p);
  sqlite3_free(local_c8.p);
  local_c8.p = (u8 *)0x0;
  local_c8.n = 0;
  local_c8.nSpace = 0;
  sqlite3_free(puVar9);
  return;
}

Assistant:

static void fts5MergePrefixLists(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Buffer *p1,                 /* First list to merge */
  Fts5Buffer *p2                  /* Second list to merge */
){
  if( p2->n ){
    i64 iLastRowid = 0;
    Fts5DoclistIter i1;
    Fts5DoclistIter i2;
    Fts5Buffer out = {0, 0, 0};
    Fts5Buffer tmp = {0, 0, 0};

    /* The maximum size of the output is equal to the sum of the two 
    ** input sizes + 1 varint (9 bytes). The extra varint is because if the
    ** first rowid in one input is a large negative number, and the first in
    ** the other a non-negative number, the delta for the non-negative
    ** number will be larger on disk than the literal integer value
    ** was.  
    **
    ** Or, if the input position-lists are corrupt, then the output might
    ** include up to 2 extra 10-byte positions created by interpreting -1
    ** (the value PoslistNext64() uses for EOF) as a position and appending
    ** it to the output. This can happen at most once for each input 
    ** position-list, hence two 10 byte paddings.  */
    if( sqlite3Fts5BufferSize(&p->rc, &out, p1->n + p2->n + 9+10+10) ) return;
    fts5DoclistIterInit(p1, &i1);
    fts5DoclistIterInit(p2, &i2);

    while( 1 ){
      if( i1.iRowid<i2.iRowid ){
        /* Copy entry from i1 */
        fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
        fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.nPoslist+i1.nSize);
        fts5DoclistIterNext(&i1);
        if( i1.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
      else if( i2.iRowid!=i1.iRowid ){
        /* Copy entry from i2 */
        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.nPoslist+i2.nSize);
        fts5DoclistIterNext(&i2);
        if( i2.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
      else{
        /* Merge the two position lists. */ 
        i64 iPos1 = 0;
        i64 iPos2 = 0;
        int iOff1 = 0;
        int iOff2 = 0;
        u8 *a1 = &i1.aPoslist[i1.nSize];
        u8 *a2 = &i2.aPoslist[i2.nSize];
        int nCopy;
        u8 *aCopy;

        i64 iPrev = 0;
        Fts5PoslistWriter writer;
        memset(&writer, 0, sizeof(writer));

        fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
        fts5BufferZero(&tmp);
        sqlite3Fts5BufferSize(&p->rc, &tmp, i1.nPoslist + i2.nPoslist);
        if( p->rc ) break;

        sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        assert_nc( iPos1>=0 && iPos2>=0 );

        if( iPos1<iPos2 ){
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
        }else{
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
        }
        if( iPos1>=0 && iPos2>=0 ){
          while( 1 ){
            if( iPos1<iPos2 ){
              if( iPos1!=iPrev ){
                sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
              }
              sqlite3Fts5PoslistNext64(a1, i1.nPoslist, &iOff1, &iPos1);
              if( iPos1<0 ) break;
            }else{
              assert_nc( iPos2!=iPrev );
              sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
              sqlite3Fts5PoslistNext64(a2, i2.nPoslist, &iOff2, &iPos2);
              if( iPos2<0 ) break;
            }
          }
        }

        if( iPos1>=0 ){
          if( iPos1!=iPrev ){
            sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos1);
          }
          aCopy = &a1[iOff1];
          nCopy = i1.nPoslist - iOff1;
        }else{
          assert_nc( iPos2>=0 && iPos2!=iPrev );
          sqlite3Fts5PoslistSafeAppend(&tmp, &iPrev, iPos2);
          aCopy = &a2[iOff2];
          nCopy = i2.nPoslist - iOff2;
        }
        if( nCopy>0 ){
          fts5BufferSafeAppendBlob(&tmp, aCopy, nCopy);
        }

        /* WRITEPOSLISTSIZE */
        fts5BufferSafeAppendVarint(&out, tmp.n * 2);
        fts5BufferSafeAppendBlob(&out, tmp.p, tmp.n);
        fts5DoclistIterNext(&i1);
        fts5DoclistIterNext(&i2);
        assert_nc( out.n<=(p1->n+p2->n+9) );
        if( i1.aPoslist==0 || i2.aPoslist==0 ) break;
        assert( out.n<=((i1.aPoslist-p1->p) + (i2.aPoslist-p2->p)+9+10+10) );
      }
    }

    if( i1.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i1.iRowid);
      fts5BufferSafeAppendBlob(&out, i1.aPoslist, i1.aEof - i1.aPoslist);
    }
    else if( i2.aPoslist ){
      fts5MergeAppendDocid(&out, iLastRowid, i2.iRowid);
      fts5BufferSafeAppendBlob(&out, i2.aPoslist, i2.aEof - i2.aPoslist);
    }
    assert_nc( out.n<=(p1->n+p2->n+9) );

    fts5BufferSet(&p->rc, p1, out.n, out.p);
    fts5BufferFree(&tmp);
    fts5BufferFree(&out);
  }
}